

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_setup_connection(connectdata *conn)

{
  SessionHandle *data;
  char *string;
  char cVar1;
  _Bool _Var2;
  CURLcode CVar3;
  long *plVar4;
  undefined1 uVar5;
  long lVar6;
  char *pcVar7;
  
  data = conn->data;
  if (((conn->bits).httpproxy == true) && ((data->set).tunnel_thru_httpproxy == false)) {
    if (conn->handler == &Curl_handler_ftp) {
      conn->handler = &Curl_handler_ftp_proxy;
      CVar3 = Curl_http_setup_conn(conn);
      return CVar3;
    }
    Curl_failf(data,"FTPS not supported!");
    CVar3 = CURLE_UNSUPPORTED_PROTOCOL;
  }
  else {
    plVar4 = (long *)(*Curl_cmalloc)(0x28);
    (conn->data->req).protop = plVar4;
    if (plVar4 == (long *)0x0) {
      CVar3 = CURLE_OUT_OF_MEMORY;
    }
    else {
      pcVar7 = (data->state).path + 1;
      (data->state).path = pcVar7;
      (data->state).slash_removed = true;
      pcVar7 = strstr(pcVar7,";type=");
      if (pcVar7 == (char *)0x0) {
        pcVar7 = strstr((conn->host).rawalloc,";type=");
      }
      if (pcVar7 != (char *)0x0) {
        *pcVar7 = '\0';
        cVar1 = Curl_raw_toupper(pcVar7[6]);
        (conn->bits).type_set = true;
        uVar5 = 1;
        lVar6 = 0x483;
        if (cVar1 != 'A') {
          if (cVar1 == 'D') {
            lVar6 = 0x485;
          }
          else {
            uVar5 = 0;
          }
        }
        *(undefined1 *)((long)data->sockets + lVar6 + -0x38) = uVar5;
      }
      *plVar4 = (long)&(conn->data->req).bytecount;
      *(undefined4 *)(plVar4 + 3) = 0;
      plVar4[4] = 0;
      pcVar7 = conn->user;
      plVar4[1] = (long)pcVar7;
      string = conn->passwd;
      plVar4[2] = (long)string;
      _Var2 = isBadFtpString(pcVar7);
      CVar3 = CURLE_URL_MALFORMAT;
      if (!_Var2) {
        _Var2 = isBadFtpString(string);
        if (!_Var2) {
          (conn->proto).ftpc.known_filesize = -1;
          CVar3 = CURLE_OK;
        }
      }
    }
  }
  return CVar3;
}

Assistant:

static CURLcode ftp_setup_connection(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;
  char *type;
  char command;
  struct FTP *ftp;

  if(conn->bits.httpproxy && !data->set.tunnel_thru_httpproxy) {
    /* Unless we have asked to tunnel ftp operations through the proxy, we
       switch and use HTTP operations only */
#ifndef CURL_DISABLE_HTTP
    if(conn->handler == &Curl_handler_ftp)
      conn->handler = &Curl_handler_ftp_proxy;
    else {
#ifdef USE_SSL
      conn->handler = &Curl_handler_ftps_proxy;
#else
      failf(data, "FTPS not supported!");
      return CURLE_UNSUPPORTED_PROTOCOL;
#endif
    }
    /* set it up as a HTTP connection instead */
    return conn->handler->setup_connection(conn);
#else
    failf(data, "FTP over http proxy requires HTTP support built-in!");
    return CURLE_UNSUPPORTED_PROTOCOL;
#endif
  }

  conn->data->req.protop = ftp = malloc(sizeof(struct FTP));
  if(NULL == ftp)
    return CURLE_OUT_OF_MEMORY;

  data->state.path++;   /* don't include the initial slash */
  data->state.slash_removed = TRUE; /* we've skipped the slash */

  /* FTP URLs support an extension like ";type=<typecode>" that
   * we'll try to get now! */
  type = strstr(data->state.path, ";type=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";type=");

  if(type) {
    *type = 0;                     /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);
    conn->bits.type_set = TRUE;

    switch (command) {
    case 'A': /* ASCII mode */
      data->set.prefer_ascii = TRUE;
      break;

    case 'D': /* directory mode */
      data->set.ftp_list_only = TRUE;
      break;

    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->set.prefer_ascii = FALSE;
      break;
    }
  }

  /* get some initial data into the ftp struct */
  ftp->bytecountp = &conn->data->req.bytecount;
  ftp->transfer = FTPTRANSFER_BODY;
  ftp->downloadsize = 0;

  /* No need to duplicate user+password, the connectdata struct won't change
     during a session, but we re-init them here since on subsequent inits
     since the conn struct may have changed or been replaced.
  */
  ftp->user = conn->user;
  ftp->passwd = conn->passwd;
  if(isBadFtpString(ftp->user))
    return CURLE_URL_MALFORMAT;
  if(isBadFtpString(ftp->passwd))
    return CURLE_URL_MALFORMAT;

  conn->proto.ftpc.known_filesize = -1; /* unknown size for now */

  return CURLE_OK;
}